

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall Inject::bind_to_self::test_method(bind_to_self *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  lazy_ostream *prev;
  impl1 *piVar4;
  undefined4 extraout_var;
  unique_id local_118;
  undefined8 local_110;
  basic_cstring<const_char> local_108;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f8;
  basic_cstring<const_char> local_d0;
  basic_cstring<const_char> local_c0;
  undefined1 local_b0 [8];
  injected<Inject::impl1> p;
  context<0> c;
  provides<Inject::impl1> local_20;
  provides<Inject::impl1> b2;
  component<Inject::impl1> b1;
  bind_to_self *this_local;
  
  inject::context<0>::component<Inject::impl1>::component((component<Inject::impl1> *)&b2);
  inject::context<0>::component<Inject::impl1>::provides<Inject::impl1>::provides(&local_20);
  inject::context<0>::context((context<0> *)&p._ptr.pn);
  inject::context<0>::bind<Inject::impl1>((context<0> *)&p._ptr.pn);
  inject::context<0>::injected<Inject::impl1>::injected((injected<Inject::impl1> *)local_b0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c0,0x18a,&local_d0);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f8,prev,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    piVar4 = inject::context<0>::injected<Inject::impl1>::operator->
                       ((injected<Inject::impl1> *)local_b0);
    iVar3 = (**(piVar4->super_service)._vptr_service)();
    local_110 = CONCAT44(extraout_var,iVar3);
    local_118 = inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_f8,&local_108,0x18a,1,2,&local_110,"p->id()",&local_118,"id_of<impl1>::id()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::injected<Inject::impl1>::~injected((injected<Inject::impl1> *)local_b0);
  inject::context<0>::~context((context<0> *)&p._ptr.pn);
  inject::context<0>::component<Inject::impl1>::provides<Inject::impl1>::~provides(&local_20);
  inject::context<0>::component<Inject::impl1>::~component((component<Inject::impl1> *)&b2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bind_to_self)
{
    context<>::component<impl1> b1;
    context<>::component<impl1>::provides<impl1> b2;

    context<> c;
    
    c.bind<impl1>();
    context<>::injected<impl1> p;
    BOOST_CHECK_EQUAL(p->id(), id_of<impl1>::id());
}